

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall
kratos::Generator::add_named_block
          (Generator *this,string *block_name,shared_ptr<kratos::StmtBlock> *block)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  StmtException *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  allocator<kratos::IRNode_*> local_111;
  element_type *local_110;
  element_type **local_108;
  size_type local_100;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_f8;
  string local_d0;
  __shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2> *local_b0;
  shared_ptr<kratos::StmtBlock> *block_local;
  string *block_name_local;
  Generator *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  shared_ptr<kratos::StmtBlock> *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_b0 = &block->super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>;
  block_local = (shared_ptr<kratos::StmtBlock> *)block_name;
  block_name_local = (string *)this;
  bVar1 = has_named_block(this,block_name);
  if (!bVar1) {
    std::
    unordered_map<std::__cxx11::string,std::shared_ptr<kratos::StmtBlock>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::StmtBlock>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::StmtBlock>const&>
              ((unordered_map<std::__cxx11::string,std::shared_ptr<kratos::StmtBlock>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::StmtBlock>>>>
                *)&this->named_blocks_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)block_local,
               (shared_ptr<kratos::StmtBlock> *)local_b0);
    return;
  }
  this_00 = (StmtException *)__cxa_allocate_exception(0x10);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&this->name;
  local_38 = &local_d0;
  local_40 = "{0} already exists in {1}";
  local_48 = block_local;
  fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[26],char>
            (&local_78,(v7 *)0x43188e,(char (*) [26])block_local,
             (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
  local_58 = &local_78;
  local_88 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_58;
  local_20 = local_58;
  local_10 = local_58;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xdd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_58);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_88.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_90.values_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_d0,(detail *)local_88.data_,format_str,args);
  local_110 = std::__shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>::get(local_b0);
  local_108 = &local_110;
  local_100 = 1;
  std::allocator<kratos::IRNode_*>::allocator(&local_111);
  __l._M_len = local_100;
  __l._M_array = (iterator)local_108;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_f8,__l,&local_111)
  ;
  StmtException::StmtException(this_00,&local_d0,&local_f8);
  __cxa_throw(this_00,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

void Generator::add_named_block(const std::string &block_name,
                                const std::shared_ptr<StmtBlock> &block) {
    if (has_named_block(block_name))
        throw StmtException(::format("{0} already exists in {1}", block_name, name), {block.get()});
    named_blocks_.emplace(block_name, block);
}